

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_stream.hpp
# Opt level: O2

int __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this,int c)

{
  string local_30;
  
  (**(code **)(*(long *)&this->super_StreamBufBase + 0x30))();
  if (c != -1) {
    if (*(long *)&(this->super_StreamBufBase).field_0x20 ==
        *(long *)&(this->super_StreamBufBase).field_0x30) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
      writeToDebugConsole(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      std::streambuf::sputc((char)this);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) {
            sync();

            if( c != EOF ) {
                if( pbase() == epptr() )
                    m_writer( std::string( 1, static_cast<char>( c ) ) );
                else
                    sputc( static_cast<char>( c ) );
            }
            return 0;
        }